

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::subpass_description_flags_is_supported
          (Impl *this,VkSubpassDescriptionFlags flags)

{
  size_type sVar1;
  bool bVar2;
  allocator local_69;
  string local_68 [37];
  byte local_43;
  byte local_42;
  allocator local_41;
  string local_40 [32];
  undefined4 local_20;
  VkSubpassDescriptionFlags local_1c;
  VkSubpassDescriptionFlags supported_flags;
  VkSubpassDescriptionFlags flags_local;
  Impl *this_local;
  
  local_20 = 0x8f;
  if ((flags & 0xffffff70) == 0) {
    local_42 = 0;
    local_43 = 0;
    bVar2 = false;
    local_1c = flags;
    _supported_flags = this;
    if ((flags & 3) != 0) {
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string(local_40,"VK_NVX_multiview_per_view_attributes",&local_41);
      local_43 = 1;
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_40);
      bVar2 = sVar1 == 0;
    }
    if ((local_43 & 1) != 0) {
      std::__cxx11::string::~string(local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = false;
      if ((local_1c & 0xc) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"VK_QCOM_render_pass_shader_resolve",&local_69);
        sVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_68);
        bVar2 = sVar1 == 0;
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
      }
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else if (((local_1c & 0x80) == 0) || ((this->features).legacy_dithering.legacyDithering != 0))
      {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::subpass_description_flags_is_supported(VkSubpassDescriptionFlags flags) const
{
	constexpr VkSubpassDescriptionFlags supported_flags =
			VK_SUBPASS_DESCRIPTION_PER_VIEW_ATTRIBUTES_BIT_NVX |
			VK_SUBPASS_DESCRIPTION_PER_VIEW_POSITION_X_ONLY_BIT_NVX |
			VK_SUBPASS_DESCRIPTION_FRAGMENT_REGION_BIT_QCOM |
			VK_SUBPASS_DESCRIPTION_SHADER_RESOLVE_BIT_QCOM |
			VK_SUBPASS_DESCRIPTION_ENABLE_LEGACY_DITHERING_BIT_EXT;

	if (flags & ~supported_flags)
		return false;

	if ((flags & (VK_SUBPASS_DESCRIPTION_PER_VIEW_ATTRIBUTES_BIT_NVX |
	              VK_SUBPASS_DESCRIPTION_PER_VIEW_POSITION_X_ONLY_BIT_NVX)) != 0 &&
	    enabled_extensions.count(VK_NVX_MULTIVIEW_PER_VIEW_ATTRIBUTES_EXTENSION_NAME) == 0)
		return false;

	if ((flags & (VK_SUBPASS_DESCRIPTION_FRAGMENT_REGION_BIT_QCOM |
	              VK_SUBPASS_DESCRIPTION_SHADER_RESOLVE_BIT_QCOM)) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_SHADER_RESOLVE_EXTENSION_NAME) == 0)
		return false;

	if ((flags & VK_SUBPASS_DESCRIPTION_ENABLE_LEGACY_DITHERING_BIT_EXT) != 0 &&
	    features.legacy_dithering.legacyDithering == VK_FALSE)
		return false;

	return true;
}